

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_server.c
# Opt level: O3

int readFromSSDPSocket(SOCKET socket)

{
  size_t *psVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  http_parser_t *parser;
  ssize_t sVar5;
  long lVar6;
  ssdp_thread_data *data;
  char *__cp;
  sockaddr *psVar7;
  http_parser_t *phVar8;
  char *__buf;
  membuffer *m;
  byte bVar9;
  socklen_t socklen;
  ThreadPoolJob job;
  sockaddr_storage __ss;
  char staticBuf [2500];
  socklen_t local_acc;
  char local_ac8 [48];
  ThreadPoolJob local_a98;
  sockaddr local_a68 [8];
  char local_9e8 [2504];
  
  bVar9 = 0;
  local_acc = 0x80;
  local_a98.func = (start_routine)0x0;
  local_a98.arg = (void *)0x0;
  local_a98.free_func = (free_routine)0x0;
  local_a98.requestTime.tv_sec = 0;
  local_a98.requestTime.tv_usec = 0;
  local_a98.priority = LOW_PRIORITY;
  local_a98.jobId = 0;
  parser = (http_parser_t *)malloc(0x270);
  __buf = local_9e8;
  if (parser == (http_parser_t *)0x0) {
LAB_0012964d:
    parser = (http_parser_t *)0x0;
  }
  else {
    if ((gSsdpReqSocket4 == socket) || (gSsdpReqSocket6 == socket)) {
      parser_response_init(parser,HTTPMETHOD_MSEARCH);
    }
    else {
      parser_request_init(parser);
    }
    m = &(parser->msg).msg;
    iVar3 = membuffer_set_size(m,0x9c4);
    if (iVar3 != 0) {
      free(parser);
      goto LAB_0012964d;
    }
    __buf = m->buf;
  }
  sVar5 = recvfrom(socket,__buf,0x9c3,0,local_a68,&local_acc);
  if (sVar5 < 1) {
    iVar3 = -1;
    if (parser == (http_parser_t *)0x0) {
      return -1;
    }
    goto LAB_001297a8;
  }
  __buf[sVar5] = '\0';
  if (local_a68[0].sa_family == 10) {
    __cp = local_a68[0].sa_data + 6;
    iVar3 = 10;
LAB_001296c4:
    inet_ntop(iVar3,__cp,local_ac8,0x2e);
  }
  else {
    if (local_a68[0].sa_family == 2) {
      __cp = local_a68[0].sa_data + 2;
      iVar3 = 2;
      goto LAB_001296c4;
    }
    local_ac8[0x2d] = 0;
    builtin_strncpy(local_ac8,"<Invalid address family>",0x19);
    local_ac8[0x19] = '\0';
    local_ac8[0x1a] = '\0';
    local_ac8[0x1b] = '\0';
    local_ac8[0x1c] = '\0';
    local_ac8[0x1d] = '\0';
    local_ac8[0x1e] = '\0';
    local_ac8[0x1f] = '\0';
    local_ac8[0x20] = '\0';
    local_ac8[0x21] = '\0';
    local_ac8[0x22] = '\0';
    local_ac8[0x23] = '\0';
    local_ac8[0x24] = '\0';
    local_ac8[0x25] = '\0';
    local_ac8[0x26] = '\0';
    local_ac8[0x27] = '\0';
    local_ac8[0x28] = '\0';
    local_ac8[0x29] = '\0';
    local_ac8[0x2a] = '\0';
    local_ac8[0x2b] = '\0';
    local_ac8[0x2c] = '\0';
  }
  UpnpPrintf(UPNP_INFO,SSDP,".upnp/src/ssdp/ssdp_server.c",0x36e,
             "Start of received response ----------------------------------------------------\n%s\nEnd of received response ------------------------------------------------------\nFrom host %s\n"
             ,__buf,local_ac8);
  if (parser == (http_parser_t *)0x0) {
    return 0;
  }
  psVar1 = &(parser->msg).msg.length;
  *psVar1 = *psVar1 + sVar5;
  (parser->msg).msg.buf[sVar5] = '\0';
  psVar7 = local_a68;
  phVar8 = parser + 1;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar2._0_2_ = psVar7->sa_family;
    uVar2._2_1_ = psVar7->sa_data[0];
    uVar2._3_1_ = psVar7->sa_data[1];
    uVar2._4_1_ = psVar7->sa_data[2];
    uVar2._5_1_ = psVar7->sa_data[3];
    uVar2._6_1_ = psVar7->sa_data[4];
    uVar2._7_1_ = psVar7->sa_data[5];
    (phVar8->msg).initialized = (int)uVar2;
    (phVar8->msg).method = (int)((ulong)uVar2 >> 0x20);
    psVar7 = (sockaddr *)(psVar7[-(ulong)bVar9].sa_data + 6);
    phVar8 = (http_parser_t *)((long)phVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  TPJobInit(&local_a98,ssdp_event_handler_thread,parser);
  TPJobSetFreeFunction(&local_a98,free_ssdp_event_handler_data);
  TPJobSetPriority(&local_a98,MED_PRIORITY);
  iVar3 = 0;
  iVar4 = ThreadPoolAdd(&gRecvThreadPool,&local_a98,(int *)0x0);
  if (iVar4 == 0) {
    return 0;
  }
LAB_001297a8:
  httpmsg_destroy(&parser->msg);
  free(parser);
  return iVar3;
}

Assistant:

int readFromSSDPSocket(SOCKET socket)
{
	char *requestBuf = NULL;
	char staticBuf[BUFSIZE];
	struct sockaddr_storage __ss;
	ThreadPoolJob job;
	ssdp_thread_data *data = NULL;
	socklen_t socklen = sizeof(__ss);
	ssize_t byteReceived = 0;
	char ntop_buf[INET6_ADDRSTRLEN];

	memset(&job, 0, sizeof(job));

	requestBuf = staticBuf;
	/* in case memory can't be allocated, still drain the socket using a
	 * static buffer. */
	data = malloc(sizeof(ssdp_thread_data));
	if (data) {
		/* initialize parser */
	#ifdef INCLUDE_CLIENT_APIS
		if (socket == gSsdpReqSocket4
		#ifdef UPNP_ENABLE_IPV6
			|| socket == gSsdpReqSocket6
		#endif /* UPNP_ENABLE_IPV6 */
		)
			parser_response_init(&data->parser, HTTPMETHOD_MSEARCH);
		else
			parser_request_init(&data->parser);
	#else  /* INCLUDE_CLIENT_APIS */
		parser_request_init(&data->parser);
	#endif /* INCLUDE_CLIENT_APIS */
		/* set size of parser buffer */
		if (membuffer_set_size(&data->parser.msg.msg, BUFSIZE) == 0)
			/* use this as the buffer for recv */
			requestBuf = data->parser.msg.msg.buf;
		else {
			free(data);
			data = NULL;
		}
	}
	byteReceived = recvfrom(socket,
		requestBuf,
		BUFSIZE - (size_t)1,
		0,
		(struct sockaddr *)&__ss,
		&socklen);
	if (byteReceived > 0) {
		requestBuf[byteReceived] = '\0';
		switch (__ss.ss_family) {
		case AF_INET:
			inet_ntop(AF_INET,
				&((struct sockaddr_in *)&__ss)->sin_addr,
				ntop_buf,
				sizeof(ntop_buf));
			break;
	#ifdef UPNP_ENABLE_IPV6
		case AF_INET6:
			inet_ntop(AF_INET6,
				&((struct sockaddr_in6 *)&__ss)->sin6_addr,
				ntop_buf,
				sizeof(ntop_buf));
			break;
	#endif /* UPNP_ENABLE_IPV6 */
		default:
			memset(ntop_buf, 0, sizeof(ntop_buf));
			strncpy(ntop_buf,
				"<Invalid address family>",
				sizeof(ntop_buf) - 1);
		}
		/* clang-format off */
		UpnpPrintf(UPNP_INFO, SSDP, __FILE__, __LINE__,
			   "Start of received response ----------------------------------------------------\n"
			   "%s\n"
			   "End of received response ------------------------------------------------------\n"
			   "From host %s\n", requestBuf, ntop_buf);
		/* clang-format on */
		/* add thread pool job to handle request */
		if (data != NULL) {
			data->parser.msg.msg.length += (size_t)byteReceived;
			/* null-terminate */
			data->parser.msg.msg.buf[byteReceived] = 0;
			memcpy(&data->dest_addr, &__ss, sizeof(__ss));
			TPJobInit(&job,
				(start_routine)ssdp_event_handler_thread,
				data);
			TPJobSetFreeFunction(
				&job, free_ssdp_event_handler_data);
			TPJobSetPriority(&job, MED_PRIORITY);
			if (ThreadPoolAdd(&gRecvThreadPool, &job, NULL) != 0)
				free_ssdp_event_handler_data(data);
		}
		return 0;
	} else {
		free_ssdp_event_handler_data(data);
		return -1;
	}
}